

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_33804::
ARTCorrectnessTest_TwoNode4_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTCorrectnessTest_TwoNode4_Test
          (ARTCorrectnessTest_TwoNode4_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, TwoNode4) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert(1, unodb::test::test_values[0]);
  verifier.insert(3, unodb::test::test_values[2]);

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_growing_inodes({1, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS

  // Insert a value that does not share full prefix with the current Node4
  verifier.insert(0xFF01, unodb::test::test_values[3]);

  verifier.check_present_values();
  verifier.check_absent_keys({0xFF00, 2});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({3, 2, 0, 0, 0});
  verifier.assert_growing_inodes({2, 0, 0, 0});
  verifier.assert_key_prefix_splits(1);
#endif  // UNODB_DETAIL_WITH_STATS
}